

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

_Bool al_join_paths(ALLEGRO_PATH *path,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  size_t sVar2;
  long in_RSI;
  ALLEGRO_PATH *in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  ALLEGRO_PATH *in_stack_ffffffffffffffd0;
  ALLEGRO_PATH *path_00;
  undefined4 local_1c;
  undefined1 local_1;
  
  _Var1 = path_is_absolute(in_stack_ffffffffffffffd0);
  if (_Var1) {
    local_1 = false;
  }
  else {
    al_ustr_assign((ALLEGRO_USTR *)in_stack_ffffffffffffffd0,
                   (ALLEGRO_USTR *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_1c = 0;
    while( true ) {
      sVar2 = _al_vector_size((_AL_VECTOR *)(in_RSI + 0x10));
      if (sVar2 <= local_1c) break;
      path_00 = in_RDI;
      get_segment_cstr(in_RDI,in_stack_ffffffffffffffcc);
      al_append_path_component
                (path_00,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_1c = local_1c + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool al_join_paths(ALLEGRO_PATH *path, const ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(path);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   /* We ignore tail->drive.  The other option is to do nothing if tail
    * contains a drive letter.
    */

   al_ustr_assign(path->filename, tail->filename);

   for (i = 0; i < _al_vector_size(&tail->segments); i++) {
      al_append_path_component(path, get_segment_cstr(tail, i));
   }

   return true;
}